

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O3

Index __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::degree(CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
         *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long lVar5;
  
  iVar1 = (*(((this->m_curve_geometry).
              super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_CurveBase<2L>)._vptr_CurveBase[2])();
  iVar2 = (*(((this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])();
  iVar3 = (*(((this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])();
  lVar5 = CONCAT44(extraout_var_00,iVar2);
  if (CONCAT44(extraout_var_00,iVar2) < CONCAT44(extraout_var,iVar1)) {
    lVar5 = CONCAT44(extraout_var,iVar1);
  }
  lVar4 = CONCAT44(extraout_var_01,iVar3);
  if (CONCAT44(extraout_var_01,iVar3) <= lVar5) {
    lVar4 = lVar5;
  }
  return lVar4;
}

Assistant:

Index degree() const override
    {
        return std::max({m_curve_geometry->degree(),
            m_surface_geometry->degree_u(), m_surface_geometry->degree_v()});
    }